

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O2

QStringList * QFontDatabase::applicationFontFamilies(QStringList *__return_storage_ptr__,int id)

{
  Type *mutex;
  iterator args;
  iterator iVar1;
  Properties *properties;
  long in_FS_OFFSET;
  ApplicationFont local_90;
  undefined1 local_48 [24];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  mutex = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>::
          operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>
                      *)__return_storage_ptr__);
  QMutexLocker<QRecursiveMutex>::QMutexLocker((QMutexLocker<QRecursiveMutex> *)local_48,mutex);
  QFontDatabasePrivate::instance();
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  (__return_storage_ptr__->d).size = 0;
  QList<QFontDatabasePrivate::ApplicationFont>::value
            (&local_90,&QFontDatabasePrivate::instance::instance.applicationFonts,(long)id);
  QList<QString>::reserve(__return_storage_ptr__,local_90.properties.d.size);
  QFontDatabasePrivate::ApplicationFont::~ApplicationFont(&local_90);
  QList<QFontDatabasePrivate::ApplicationFont>::value
            (&local_90,&QFontDatabasePrivate::instance::instance.applicationFonts,(long)id);
  args = QList<QFontDatabasePrivate::ApplicationFont::Properties>::begin(&local_90.properties);
  iVar1 = QList<QFontDatabasePrivate::ApplicationFont::Properties>::end(&local_90.properties);
  for (; args.i != iVar1.i; args.i = args.i + 1) {
    QList<QString>::emplaceBack<QString_const&>(__return_storage_ptr__,&(args.i)->familyName);
  }
  QFontDatabasePrivate::ApplicationFont::~ApplicationFont(&local_90);
  QMutexLocker<QRecursiveMutex>::~QMutexLocker((QMutexLocker<QRecursiveMutex> *)local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QFontDatabase::applicationFontFamilies(int id)
{
    QMutexLocker locker(fontDatabaseMutex());
    auto *d = QFontDatabasePrivate::instance();

    QStringList ret;
    ret.reserve(d->applicationFonts.value(id).properties.size());

    for (const auto &properties : d->applicationFonts.value(id).properties)
        ret.append(properties.familyName);

    return ret;
}